

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_ScattervGeneral_Test::TestBody(MxxColl_ScattervGeneral_Test *this)

{
  allocator<int> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference out;
  size_type sVar6;
  char *message;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  int j_1;
  vector<int,_std::allocator<int>_> result;
  ulong local_80;
  size_t j;
  int i;
  undefined1 local_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  vector<int,_std::allocator<int>_> vec;
  undefined1 local_30 [8];
  comm c;
  MxxColl_ScattervGeneral_Test *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&ompi_mpi_comm_world;
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30,
                  (MPI_Comm *)
                  &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  iVar2 = mxx::comm::rank((comm *)local_30);
  if (iVar2 == 0) {
    iVar2 = mxx::comm::size((comm *)local_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(long)iVar2);
    for (j._0_4_ = 0; iVar2 = mxx::comm::size((comm *)local_30), (int)j < iVar2;
        j._0_4_ = (int)j + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                          (long)(int)j);
      *pvVar4 = (long)((int)j + 1);
      for (local_80 = 0; local_80 < (ulong)(long)((int)j + 1); local_80 = local_80 + 1) {
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = (int)j * 3 + (int)local_80 * 2;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict *)
                   ((long)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
    }
  }
  iVar2 = mxx::comm::rank((comm *)local_30);
  this_00 = (allocator<int> *)((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&j_1,(long)(iVar2 + 1),this_00);
  std::allocator<int>::~allocator((allocator<int> *)((long)&gtest_ar.message_.ptr_ + 7));
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  out = std::vector<int,_std::allocator<int>_>::front((vector<int,_std::allocator<int>_> *)&j_1);
  iVar2 = mxx::comm::rank((comm *)local_30);
  mxx::scatterv<int>(pvVar5,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,out,
                     (long)(iVar2 + 1),0,(comm *)local_30);
  for (gtest_ar.message_.ptr_._0_4_ = 0; iVar2 = (int)gtest_ar.message_.ptr_,
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&j_1), iVar2 < (int)sVar6;
      gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
    iVar2 = (int)gtest_ar.message_.ptr_ * 2;
    iVar3 = mxx::comm::rank((comm *)local_30);
    local_bc = iVar2 + iVar3 * 3;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&j_1,(long)(int)gtest_ar.message_.ptr_)
    ;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b8,"2*j+3*c.rank()","result[j]",&local_bc,pvVar5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0x93,message);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (!bVar1) break;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&j_1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxColl, ScattervGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(2*j + 3*i);
            }
        }
    }

    // test general case
    std::vector<int> result(c.rank()+1);
    mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}